

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_executor.cpp
# Opt level: O2

PipelineExecuteResult __thiscall
duckdb::PipelineExecutor::Execute(PipelineExecutor *this,idx_t max_chunks)

{
  OperatorResultType OVar1;
  SourceResultType SVar2;
  bool bVar3;
  PipelineExecuteResult PVar4;
  reference this_00;
  type this_01;
  InterruptException *this_02;
  InternalException *this_03;
  byte bVar5;
  allocator local_59;
  ExecutionBudget chunk_budget;
  string local_48;
  
  if ((this->pipeline->operators).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->pipeline->operators).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_01 = &this->final_chunk;
  }
  else {
    this_00 = vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
              ::get<true>(&this->intermediate_chunks,0);
    this_01 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator*
                        (this_00);
  }
  chunk_budget.processed = 0;
  chunk_budget.maximum_to_process = max_chunks;
  do {
    if (((((this->context).client)->interrupted)._M_base._M_i & 1U) != 0) {
      this_02 = (InterruptException *)__cxa_allocate_exception(0x10);
      InterruptException::InterruptException(this_02);
      __cxa_throw(this_02,&InterruptException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (this->exhausted_source == false) {
      bVar5 = this->remaining_sink_chunk;
    }
    else {
      bVar5 = this->remaining_sink_chunk;
      if ((((this->done_flushing == true) && ((bVar5 & 1) == 0)) &&
          (this->next_batch_blocked == false)) &&
         ((this->in_process_operators).c.
          super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur ==
          (this->in_process_operators).c.
          super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur)) goto LAB_014a662f;
    }
    if ((bVar5 & 1) == 0) {
      if (((this->in_process_operators).c.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur !=
           (this->in_process_operators).c.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur) && (this->started_flushing == false)) {
LAB_014a65ca:
        OVar1 = ExecutePushInternal(this,this_01,&chunk_budget,0);
        goto LAB_014a65da;
      }
      if (this->exhausted_source == false) {
        if ((this->next_batch_blocked & 1U) == 0) {
          DataChunk::Reset(this_01);
          SVar2 = FetchFromSource(this,this_01);
          if (SVar2 == FINISHED) {
            this->exhausted_source = true;
          }
          else if (SVar2 == BLOCKED) {
            return (uint)SVar2;
          }
        }
      }
      else if ((this->next_batch_blocked & 1U) == 0) {
        if (this->done_flushing != false) {
          this_03 = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_48,"Unexpected state reached in pipeline executor",&local_59);
          InternalException::InternalException(this_03,&local_48);
          __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        bVar3 = TryFlushCachingOperators(this,&chunk_budget);
        if (!bVar3) {
          return this->remaining_sink_chunk + NOT_FINISHED;
        }
        this->done_flushing = true;
        goto LAB_014a662f;
      }
      if (((this->required_partition_info).partition_columns.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start !=
           (this->required_partition_info).partition_columns.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish) ||
         (((this->required_partition_info).batch_index & 1U) != 0)) {
        bVar3 = (bool)NextBatch(this,this_01);
        this->next_batch_blocked = bVar3;
        if (bVar3 != false) {
          return INTERRUPTED;
        }
      }
      if ((this->exhausted_source != true) || (this_01->count != 0)) goto LAB_014a65ca;
    }
    else {
      OVar1 = ExecutePushInternal(this,&this->final_chunk,&chunk_budget,0);
      this->remaining_sink_chunk = false;
LAB_014a65da:
      if (OVar1 == FINISHED) goto LAB_014a662f;
      if (OVar1 == BLOCKED) {
        this->remaining_sink_chunk = true;
        return INTERRUPTED;
      }
    }
    if (chunk_budget.maximum_to_process <= chunk_budget.processed) {
LAB_014a662f:
      if (((this->exhausted_source != true) || (this->done_flushing == false)) &&
         (this->finished_processing_idx < 0)) {
        return NOT_FINISHED;
      }
      PVar4 = PushFinalize(this);
      return PVar4;
    }
    chunk_budget.processed = chunk_budget.processed + 1;
  } while( true );
}

Assistant:

PipelineExecuteResult PipelineExecutor::Execute(idx_t max_chunks) {
	D_ASSERT(pipeline.sink);
	auto &source_chunk = pipeline.operators.empty() ? final_chunk : *intermediate_chunks[0];
	ExecutionBudget chunk_budget(max_chunks);
	do {
		if (context.client.interrupted) {
			throw InterruptException();
		}

		OperatorResultType result;
		if (exhausted_source && done_flushing && !remaining_sink_chunk && !next_batch_blocked &&
		    in_process_operators.empty()) {
			break;
		} else if (remaining_sink_chunk) {
			// The pipeline was interrupted by the Sink. We should retry sinking the final chunk.
			result = ExecutePushInternal(final_chunk, chunk_budget);
			D_ASSERT(result != OperatorResultType::HAVE_MORE_OUTPUT);
			remaining_sink_chunk = false;
		} else if (!in_process_operators.empty() && !started_flushing) {
			// Operator(s) in the pipeline have returned `HAVE_MORE_OUTPUT` in the last Execute call
			// the operators have to be called with the same input chunk to produce the rest of the output
			D_ASSERT(source_chunk.size() > 0);
			result = ExecutePushInternal(source_chunk, chunk_budget);
		} else if (exhausted_source && !next_batch_blocked && !done_flushing) {
			// The source was exhausted, try flushing all operators
			auto flush_completed = TryFlushCachingOperators(chunk_budget);
			if (flush_completed) {
				done_flushing = true;
				break;
			} else {
				if (remaining_sink_chunk) {
					return PipelineExecuteResult::INTERRUPTED;
				} else {
					D_ASSERT(chunk_budget.IsDepleted());
					return PipelineExecuteResult::NOT_FINISHED;
				}
			}
		} else if (!exhausted_source || next_batch_blocked) {
			SourceResultType source_result;
			if (!next_batch_blocked) {
				// "Regular" path: fetch a chunk from the source and push it through the pipeline
				source_chunk.Reset();
				source_result = FetchFromSource(source_chunk);
				if (source_result == SourceResultType::BLOCKED) {
					return PipelineExecuteResult::INTERRUPTED;
				}
				if (source_result == SourceResultType::FINISHED) {
					exhausted_source = true;
				}
			}

			if (required_partition_info.AnyRequired()) {
				auto next_batch_result = NextBatch(source_chunk);
				next_batch_blocked = next_batch_result == SinkNextBatchType::BLOCKED;
				if (next_batch_blocked) {
					return PipelineExecuteResult::INTERRUPTED;
				}
			}

			if (exhausted_source && source_chunk.size() == 0) {
				// To ensure that we're not early-terminating the pipeline
				continue;
			}

			result = ExecutePushInternal(source_chunk, chunk_budget);
		} else {
			throw InternalException("Unexpected state reached in pipeline executor");
		}

		// SINK INTERRUPT
		if (result == OperatorResultType::BLOCKED) {
			remaining_sink_chunk = true;
			return PipelineExecuteResult::INTERRUPTED;
		}

		if (result == OperatorResultType::FINISHED) {
			break;
		}
	} while (chunk_budget.Next());

	if ((!exhausted_source || !done_flushing) && !IsFinished()) {
		return PipelineExecuteResult::NOT_FINISHED;
	}

	return PushFinalize();
}